

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon_x11.cpp
# Opt level: O0

void __thiscall
QSystemTrayIconSys::QSystemTrayIconSys(QSystemTrayIconSys *this,QSystemTrayIcon *qIn)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  char16_t *str;
  QSize size;
  int in_stack_ffffffffffffff08;
  WindowType in_stack_ffffffffffffff0c;
  undefined1 enable;
  QFlags<Qt::WindowType> *in_stack_ffffffffffffff10;
  QWidget *this_00;
  QWidget *in_stack_ffffffffffffff18;
  QSize *s;
  QWidget *in_stack_ffffffffffffff20;
  QWidget *this_01;
  undefined8 in_stack_ffffffffffffff28;
  QFlagsStorage<Qt::WindowType> f;
  QWidget *this_02;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 uVar1;
  QRect *r;
  QWidget *this_03;
  undefined8 uVar2;
  char16_t *this_04;
  QRect local_70;
  undefined1 *local_60;
  undefined1 local_58 [48];
  QSize local_28 [3];
  QFlagsStorageHelper<Qt::WindowType,_4> local_c;
  long local_8;
  
  f.i = (Int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c.super_QFlagsStorage<Qt::WindowType>.i =
       (QFlagsStorage<Qt::WindowType>)
       Qt::operator|((enum_type)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                     (enum_type)in_stack_ffffffffffffff10);
  QFlags<Qt::WindowType>::operator|(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  uVar1 = 0;
  this_00 = (QWidget *)0x0;
  QWidget::QWidget(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(WindowFlags)f.i);
  *in_RDI = &PTR_metaObject_00d373d0;
  in_RDI[2] = &PTR__QSystemTrayIconSys_00d37580;
  in_RDI[5] = in_RSI;
  this_01 = (QWidget *)(local_58 + 0x18);
  this_04 = L"QSystemTrayIconSys";
  uVar2 = 0;
  QArrayDataPointer<char16_t>::QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)this_01,(Data *)this_00,L"QSystemTrayIconSys",0x12);
  s = local_28;
  QString::QString((QString *)this_00,
                   (DataPointer *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  QObject::setObjectName<void>
            (&this_00->super_QObject,
             (QString *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  QString::~QString((QString *)0xa9a3ca);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_00);
  this_02 = (QWidget *)local_58;
  QSystemTrayIcon::toolTip((QSystemTrayIcon *)s);
  QWidget::setToolTip(this_02,(QString *)this_01);
  QString::~QString((QString *)0xa9a408);
  QWidget::setAttribute
            ((QWidget *)this_04,(WidgetAttribute)((ulong)uVar2 >> 0x20),
             SUB81((ulong)uVar2 >> 0x18,0));
  QWidget::setAttribute
            ((QWidget *)this_04,(WidgetAttribute)((ulong)uVar2 >> 0x20),
             SUB81((ulong)uVar2 >> 0x18,0));
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  this_03 = (QWidget *)&local_60;
  QSize::QSize((QSize *)this_00,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
  QPoint::QPoint((QPoint *)this_00,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
  enable = (undefined1)(in_stack_ffffffffffffff0c >> 0x18);
  r = &local_70;
  QRect::QRect((QRect *)CONCAT44(uVar1,in_stack_ffffffffffffff30),(QPoint *)this_02,(QSize *)this_01
              );
  QWidget::setGeometry(this_03,r);
  QWidget::setMinimumSize(this_01,s);
  QWidget::setAttribute
            ((QWidget *)this_04,(WidgetAttribute)((ulong)uVar2 >> 0x20),
             SUB81((ulong)uVar2 >> 0x18,0));
  QWidget::setMouseTracking(this_00,(bool)enable);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QSystemTrayIconSys::QSystemTrayIconSys(QSystemTrayIcon *qIn)
    : QWidget(nullptr, Qt::Window | Qt::FramelessWindowHint | Qt::BypassWindowManagerHint)
    , q(qIn)
{
    setObjectName(QStringLiteral("QSystemTrayIconSys"));
#if QT_CONFIG(tooltip)
    setToolTip(q->toolTip());
#endif
    setAttribute(Qt::WA_AlwaysShowToolTips, true);
    setAttribute(Qt::WA_QuitOnClose, false);
    const QSize size(22, 22); // Gnome, standard size
    setGeometry(QRect(QPoint(0, 0), size));
    setMinimumSize(size);
    setAttribute(Qt::WA_TranslucentBackground);
    setMouseTracking(true);
}